

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
::LookupBucketFor<llbuild::core::CancellationDelegate*>
          (DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
           *this,CancellationDelegate **Val,
          DenseSetPair<llbuild::core::CancellationDelegate_*> **FoundBucket)

{
  CancellationDelegate *pCVar1;
  CancellationDelegate *pCVar2;
  bool bVar3;
  uint uVar4;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar5;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar6;
  int iVar7;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar6 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0;
LAB_001ad70e:
    bVar3 = false;
  }
  else {
    pCVar1 = *Val;
    if (((ulong)pCVar1 | 8) == 0xfffffffffffffff8) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, BucketT = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, LookupKeyT = llbuild::core::CancellationDelegate *]"
                   );
    }
    uVar4 = (uint)((ulong)pCVar1 >> 9) & 0x7fffff ^ (uint)((ulong)pCVar1 >> 4) & 0xfffffff;
    iVar7 = 1;
    pDVar5 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0;
    while( true ) {
      uVar4 = uVar4 & *(int *)(this + 0x10) - 1U;
      pDVar6 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)
               (*(long *)this + (ulong)uVar4 * 8);
      pCVar2 = pDVar6->key;
      bVar3 = true;
      if (pCVar1 == pCVar2) break;
      if (pCVar2 == (CancellationDelegate *)0xfffffffffffffff8) {
        if (pDVar5 != (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0) {
          pDVar6 = pDVar5;
        }
        goto LAB_001ad70e;
      }
      if (pCVar2 == (CancellationDelegate *)0xfffffffffffffff0 &&
          pDVar5 == (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0) {
        pDVar5 = pDVar6;
      }
      uVar4 = uVar4 + iVar7;
      iVar7 = iVar7 + 1;
    }
  }
  *FoundBucket = pDVar6;
  return bVar3;
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }